

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_sub_CC(DisasContext_conflict14 *ctx,TCGv_i32 ret,TCGv_i32 r1,TCGv_i32 r2)

{
  TCGContext_conflict9 *tcg_ctx_00;
  TCGv_i32 ret_00;
  TCGv_i32 ret_01;
  TCGv_i32 temp;
  TCGv_i32 result;
  TCGContext_conflict9 *tcg_ctx;
  TCGv_i32 r2_local;
  TCGv_i32 r1_local;
  TCGv_i32 ret_local;
  DisasContext_conflict14 *ctx_local;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  ret_00 = tcg_temp_new_i32(tcg_ctx_00);
  ret_01 = tcg_temp_new_i32(tcg_ctx_00);
  tcg_gen_sub_i32(tcg_ctx_00,ret_00,r1,r2);
  tcg_gen_setcond_i32_tricore(tcg_ctx_00,TCG_COND_GEU,tcg_ctx_00->cpu_PSW_C,r1,r2);
  tcg_gen_xor_i32(tcg_ctx_00,tcg_ctx_00->cpu_PSW_V,ret_00,r1);
  tcg_gen_xor_i32(tcg_ctx_00,ret_01,r1,r2);
  tcg_gen_and_i32(tcg_ctx_00,tcg_ctx_00->cpu_PSW_V,tcg_ctx_00->cpu_PSW_V,ret_01);
  tcg_gen_or_i32(tcg_ctx_00,tcg_ctx_00->cpu_PSW_SV,tcg_ctx_00->cpu_PSW_SV,tcg_ctx_00->cpu_PSW_V);
  tcg_gen_add_i32(tcg_ctx_00,tcg_ctx_00->cpu_PSW_AV,ret_00,ret_00);
  tcg_gen_xor_i32(tcg_ctx_00,tcg_ctx_00->cpu_PSW_AV,ret_00,tcg_ctx_00->cpu_PSW_AV);
  tcg_gen_or_i32(tcg_ctx_00,tcg_ctx_00->cpu_PSW_SAV,tcg_ctx_00->cpu_PSW_SAV,tcg_ctx_00->cpu_PSW_AV);
  tcg_gen_mov_i32(tcg_ctx_00,ret,ret_00);
  tcg_temp_free_i32(tcg_ctx_00,ret_00);
  tcg_temp_free_i32(tcg_ctx_00,ret_01);
  return;
}

Assistant:

static inline void gen_sub_CC(DisasContext *ctx, TCGv ret, TCGv r1, TCGv r2)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;

    TCGv result = tcg_temp_new(tcg_ctx);
    TCGv temp = tcg_temp_new(tcg_ctx);

    tcg_gen_sub_tl(tcg_ctx, result, r1, r2);
    /* calc C bit */
    tcg_gen_setcond_tl(tcg_ctx, TCG_COND_GEU, tcg_ctx->cpu_PSW_C, r1, r2);
    /* calc V bit */
    tcg_gen_xor_tl(tcg_ctx, tcg_ctx->cpu_PSW_V, result, r1);
    tcg_gen_xor_tl(tcg_ctx, temp, r1, r2);
    tcg_gen_and_tl(tcg_ctx, tcg_ctx->cpu_PSW_V, tcg_ctx->cpu_PSW_V, temp);
    /* calc SV bit */
    tcg_gen_or_tl(tcg_ctx, tcg_ctx->cpu_PSW_SV, tcg_ctx->cpu_PSW_SV, tcg_ctx->cpu_PSW_V);
    /* Calc AV bit */
    tcg_gen_add_tl(tcg_ctx, tcg_ctx->cpu_PSW_AV, result, result);
    tcg_gen_xor_tl(tcg_ctx, tcg_ctx->cpu_PSW_AV, result, tcg_ctx->cpu_PSW_AV);
    /* calc SAV bit */
    tcg_gen_or_tl(tcg_ctx, tcg_ctx->cpu_PSW_SAV, tcg_ctx->cpu_PSW_SAV, tcg_ctx->cpu_PSW_AV);
    /* write back result */
    tcg_gen_mov_tl(tcg_ctx, ret, result);

    tcg_temp_free(tcg_ctx, result);
    tcg_temp_free(tcg_ctx, temp);
}